

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::udp_tracker_connection::on_timeout(udp_tracker_connection *this,error_code *ec)

{
  shared_ptr<libtorrent::aux::request_callback> cb;
  _func_int **local_30;
  element_type *local_28;
  error_code local_20;
  
  if (ec->failed_ == true) {
    fail(this,ec,timer,"",(seconds32)0x0,(seconds32)0x1e);
    return;
  }
  tracker_connection::requester((tracker_connection *)&stack0xffffffffffffffd0);
  if (local_30 != (_func_int **)0x0) {
    (**(code **)(*local_30 + 0x38))
              (local_30,"*** UDP_TRACKER [ timed out url: %s ]",
               (this->super_tracker_connection).m_req.url._M_dataplus._M_p);
  }
  local_20 = errors::make_error_code(timed_out);
  fail(this,&stack0xffffffffffffffe0,timer,"",(seconds32)0x0,(seconds32)0x1e);
  if (local_28 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  return;
}

Assistant:

void udp_tracker_connection::on_timeout(error_code const& ec)
	{
		if (ec)
		{
			fail(ec, operation_t::timer);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb) cb->debug_log("*** UDP_TRACKER [ timed out url: %s ]", tracker_req().url.c_str());
#endif
		fail(error_code(errors::timed_out), operation_t::timer);
	}